

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O2

void __thiscall nv::DirectDrawSurface::DirectDrawSurface(DirectDrawSurface *this,char *name)

{
  int iVar1;
  Stream *this_00;
  
  this_00 = (Stream *)operator_new(0x20);
  StdInputStream::StdInputStream((StdInputStream *)this_00,name);
  this->stream = this_00;
  DDSHeader::DDSHeader(&this->header);
  iVar1 = (*this->stream->_vptr_Stream[6])();
  if ((char)iVar1 != '\0') {
    return;
  }
  operator<<(this->stream,&this->header);
  return;
}

Assistant:

DirectDrawSurface::DirectDrawSurface(const char * name) : stream(new StdInputStream(name))
{
	if (!stream->isError())
	{
		(*stream) << header;
	}
}